

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitPLTerm
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,PLTerm e)

{
  int iVar1;
  BasicWriter<char> *pBVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicStringRef<char> value_01;
  BasicStringRef<char> value_02;
  BasicStringRef<char> value_03;
  
  value.size_ = 2;
  value.data_ = "<<";
  pBVar2 = fmt::BasicWriter<char>::operator<<(this->writer_,value);
  fmt::BasicWriter<char>::operator<<
            (pBVar2,*(double *)
                     ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase
                            .impl_ + 0x18));
  iVar1 = *(int *)((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                         impl_ + 4);
  pdVar3 = (double *)
           ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_ +
           0x28);
  for (lVar6 = 1; lVar6 < iVar1; lVar6 = lVar6 + 1) {
    value_00.size_ = 2;
    value_00.data_ = ", ";
    pBVar2 = fmt::BasicWriter<char>::operator<<(this->writer_,value_00);
    fmt::BasicWriter<char>::operator<<(pBVar2,*pdVar3);
    pdVar3 = pdVar3 + 2;
  }
  value_01.size_ = 2;
  value_01.data_ = "; ";
  pBVar2 = fmt::BasicWriter<char>::operator<<(this->writer_,value_01);
  fmt::BasicWriter<char>::operator<<
            (pBVar2,*(double *)
                     ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase
                            .impl_ + 0x10));
  uVar4 = 0;
  uVar5 = (ulong)*(uint *)((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.
                                 super_ExprBase.impl_ + 4);
  if ((int)*(uint *)((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                           impl_ + 4) < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
    value_02.size_ = 2;
    value_02.data_ = ", ";
    pBVar2 = fmt::BasicWriter<char>::operator<<(this->writer_,value_02);
    fmt::BasicWriter<char>::operator<<
              (pBVar2,*(double *)
                       ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.
                              super_ExprBase.impl_ + 0x20 + uVar4));
  }
  value_03.size_ = 3;
  value_03.data_ = ">> ";
  fmt::BasicWriter<char>::operator<<(this->writer_,value_03);
  Visit(this,(NumericExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.impl_ +
             8))->impl_,-1);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitPLTerm(PLTerm e) {
  writer_ << "<<" << e.breakpoint(0);
  for (int i = 1, n = e.num_breakpoints(); i < n; ++i)
    writer_ << ", " << e.breakpoint(i);
  writer_ << "; " << e.slope(0);
  for (int i = 1, n = e.num_slopes(); i < n; ++i)
    writer_ << ", " << e.slope(i);
  writer_ << ">> ";
  Visit( e.arg() );
}